

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void * Fossilize::pnext_chain_skip_ignored_entries(void *pNext)

{
  VkStructureType VVar1;
  bool bVar2;
  bool ignored;
  VkBaseInStructure *base;
  void *pNext_local;
  
  base = (VkBaseInStructure *)pNext;
  while( true ) {
    if (base == (VkBaseInStructure *)0x0) {
      return (void *)0x0;
    }
    VVar1 = base->sType;
    if ((((VVar1 == VK_STRUCTURE_TYPE_DEBUG_UTILS_OBJECT_NAME_INFO_EXT) ||
         (VVar1 == VK_STRUCTURE_TYPE_SHADER_MODULE_VALIDATION_CACHE_CREATE_INFO_EXT)) ||
        (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATION_FEEDBACK_CREATE_INFO)) ||
       (((VVar1 == VK_STRUCTURE_TYPE_VALIDATION_FEATURES_EXT ||
         (VVar1 + ~VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT < 2)) ||
        (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR)))) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    if (!bVar2) break;
    base = base->pNext;
  }
  return base;
}

Assistant:

static const void *pnext_chain_skip_ignored_entries(const void *pNext)
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);
		bool ignored;

		switch (base->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_CREATION_FEEDBACK_CREATE_INFO_EXT:
		case VK_STRUCTURE_TYPE_SHADER_MODULE_VALIDATION_CACHE_CREATE_INFO_EXT:
		case VK_STRUCTURE_TYPE_DEBUG_UTILS_OBJECT_NAME_INFO_EXT:
		case VK_STRUCTURE_TYPE_VALIDATION_FEATURES_EXT:
		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_FEEDBACK_CREATE_INFO_EXT:
		case VK_STRUCTURE_TYPE_RENDER_PASS_SUBPASS_FEEDBACK_CREATE_INFO_EXT:
		case VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR:
			// We need to ignore any pNext struct which represents output information from a pipeline object, or
			// irrelevant information which only tooling would care about.
			ignored = true;
			break;

		default:
			ignored = false;
			break;
		}

		if (ignored)
			pNext = base->pNext;
		else
			break;
	}

	return pNext;
}